

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<5,_2,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  long lVar2;
  int row;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  bool bVar7;
  undefined4 uVar8;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Mat3 m;
  long lVar6;
  
  pfVar1 = (float *)&m;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    auVar5 = _DAT_019f34d0;
    do {
      bVar7 = SUB164(auVar5 ^ _DAT_019ec5b0,4) == -0x80000000 &&
              SUB164(auVar5 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
      if (bVar7) {
        uVar8 = 0x3f800000;
        if (lVar2 != lVar4) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar4) = uVar8;
      }
      if (bVar7) {
        uVar8 = 0x3f800000;
        if (lVar2 + -0xc != lVar4) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar4 + 0xc) = uVar8;
      }
      lVar6 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar6 + 2;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x30);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0xc;
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 3);
  m.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
  m.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
  m.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  m.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  m.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  m.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  m.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  stack0xffffffffffffffc8 = stack0xffffffffffffffc8 & 0xffffffff00000000;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = m.m_data.m_data[0].m_data[lVar2] + m.m_data.m_data[1].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  res_1.m_data[2] = 0.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = res.m_data[lVar2] + m.m_data.m_data[2].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  stack0xffffffffffffffc8 = 0x100000000;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)res.m_data[lVar2]] = res_1.m_data[lVar2 + -2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0));
	}